

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_scalar_json
          (Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,csubstr s,bool as_key,bool use_quotes)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  int iVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  size_t *psVar7;
  char *pcVar8;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  undefined3 in_register_00000081;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  basic_substring<const_char> local_50;
  basic_substring<const_char> local_40;
  
  sVar12 = s.len;
  pcVar8 = s.str;
  local_50.str = pcVar8;
  local_50.len = sVar12;
  if (((int)CONCAT71(in_register_00000009,as_key) == 0 &&
       CONCAT31(in_register_00000081,use_quotes) == 0) &&
     ((((iVar5 = basic_substring<const_char>::compare(&local_50,"true",4), iVar5 == 0 ||
        (iVar5 = basic_substring<const_char>::compare(&local_50,"false",5), iVar5 == 0)) ||
       (iVar5 = basic_substring<const_char>::compare(&local_50,"null",4), iVar5 == 0)) ||
      ((bVar3 = basic_substring<const_char>::is_number(&local_50), bVar3 &&
       (((sVar12 = local_50.len, pcVar8 = local_50.str, local_50.len < 2 || (*local_50.str != '0'))
        || (sVar6 = basic_substring<const_char>::first_of(&local_50,'.',0), sVar12 = local_50.len,
           pcVar8 = local_50.str, sVar6 != 0xffffffffffffffff)))))))) {
    if (pcVar8 == (char *)0x0 || sVar12 == 0) {
      return;
    }
    std::ostream::write((char *)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream,(long)pcVar8);
  }
  else {
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream);
    psVar7 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar7 = *psVar7 + 1;
    if (local_50.len != 0) {
      uVar11 = 0;
      uVar10 = 0;
      do {
        cVar1 = local_50.str[uVar10];
        switch(cVar1) {
        case '\b':
          if (local_50.len < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar10 < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_40,local_50.str + uVar11,uVar10 - uVar11);
          sVar12 = local_40.len;
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,(long)local_40.str);
            psVar7 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar7 = *psVar7 + sVar12;
          }
          pbVar9 = (this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).m_stream;
          pcVar8 = "\\b";
          break;
        case '\t':
          if (local_50.len < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar10 < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_40,local_50.str + uVar11,uVar10 - uVar11);
          sVar12 = local_40.len;
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,(long)local_40.str);
            psVar7 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar7 = *psVar7 + sVar12;
          }
          pbVar9 = (this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).m_stream;
          pcVar8 = "\\t";
          break;
        case '\n':
          if (local_50.len < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar10 < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_40,local_50.str + uVar11,uVar10 - uVar11);
          sVar12 = local_40.len;
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,(long)local_40.str);
            psVar7 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar7 = *psVar7 + sVar12;
          }
          pbVar9 = (this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).m_stream;
          pcVar8 = "\\n";
          break;
        case '\v':
switchD_00198407_caseD_b:
          goto LAB_00198737;
        case '\f':
          if (local_50.len < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar10 < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_40,local_50.str + uVar11,uVar10 - uVar11);
          sVar12 = local_40.len;
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,(long)local_40.str);
            psVar7 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar7 = *psVar7 + sVar12;
          }
          pbVar9 = (this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).m_stream;
          pcVar8 = "\\f";
          break;
        case '\r':
          if (local_50.len < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1544,"first >= 0 && first <= len");
          }
          if (uVar10 < uVar11) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1546,"first <= last");
          }
          if (local_50.len < uVar10) {
            eVar4 = get_error_flags();
            if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
              pcVar2 = (code *)swi(3);
              (*pcVar2)();
              return;
            }
            handle_error(0x1f8007,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1547,"last >= 0 && last <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_40,local_50.str + uVar11,uVar10 - uVar11);
          sVar12 = local_40.len;
          if (local_40.str != (char *)0x0 && local_40.len != 0) {
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,(long)local_40.str);
            psVar7 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar7 = *psVar7 + sVar12;
          }
          pbVar9 = (this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).m_stream;
          pcVar8 = "\\r";
          break;
        default:
          if (cVar1 == '\"') {
            if (local_50.len < uVar11) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            if (uVar10 < uVar11) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (local_50.len < uVar10) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_40,local_50.str + uVar11,uVar10 - uVar11);
            sVar12 = local_40.len;
            if (local_40.str != (char *)0x0 && local_40.len != 0) {
              std::ostream::write((char *)(this->
                                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ).m_stream,(long)local_40.str);
              psVar7 = &(this->
                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_pos;
              *psVar7 = *psVar7 + sVar12;
            }
            pbVar9 = (this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ).m_stream;
            pcVar8 = "\\\"";
          }
          else {
            if (cVar1 != '\\') goto switchD_00198407_caseD_b;
            if (local_50.len < uVar11) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            if (uVar10 < uVar11) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (local_50.len < uVar10) {
              eVar4 = get_error_flags();
              if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
                pcVar2 = (code *)swi(3);
                (*pcVar2)();
                return;
              }
              handle_error(0x1f8007,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_40,local_50.str + uVar11,uVar10 - uVar11);
            sVar12 = local_40.len;
            if (local_40.str != (char *)0x0 && local_40.len != 0) {
              std::ostream::write((char *)(this->
                                          super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ).m_stream,(long)local_40.str);
              psVar7 = &(this->
                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ).m_pos;
              *psVar7 = *psVar7 + sVar12;
            }
            pbVar9 = (this->
                     super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ).m_stream;
            pcVar8 = "\\\\";
          }
        }
        std::ostream::write((char *)pbVar9,(long)pcVar8);
        psVar7 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar7 = *psVar7 + 2;
        uVar11 = uVar10 + 1;
LAB_00198737:
        uVar10 = uVar10 + 1;
      } while (uVar10 < local_50.len);
      if ((uVar11 <= local_50.len && local_50.len - uVar11 != 0) &&
         (basic_substring<const_char>::basic_substring
                    (&local_40,local_50.str + uVar11,local_50.len - uVar11),
         local_40.str != (char *)0x0 && local_40.len != 0)) {
        std::ostream::write((char *)(this->
                                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ).m_stream,(long)local_40.str);
        psVar7 = &(this->
                  super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).m_pos;
        *psVar7 = *psVar7 + local_40.len;
      }
    }
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream);
    sVar12 = 1;
  }
  psVar7 = &(this->
            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ).m_pos;
  *psVar7 = *psVar7 + sVar12;
  return;
}

Assistant:

void Emitter<Writer>::_write_scalar_json(csubstr s, bool as_key, bool use_quotes)
{
    if((!use_quotes)
       // json keys require quotes
       && (!as_key)
       && (
           // do not quote special cases
           (s == "true" || s == "false" || s == "null")
           || (
               // do not quote numbers
               (s.is_number()
                && (
                    // quote integral numbers if they have a leading 0
                    // https://github.com/biojppm/rapidyaml/issues/291
                    (!(s.len > 1 && s.begins_with('0')))
                    // do not quote reals with leading 0
                    // https://github.com/biojppm/rapidyaml/issues/313
                    || (s.find('.') != csubstr::npos) ))
               )
           )
        )
    {
        this->Writer::_do_write(s);
    }
    else
    {
        size_t pos = 0;
        this->Writer::_do_write('"');
        for(size_t i = 0; i < s.len; ++i)
        {
            switch(s.str[i])
            {
            case '"':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\"");
              pos = i + 1;
              break;
            case '\n':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\n");
              pos = i + 1;
              break;
            case '\t':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\t");
              pos = i + 1;
              break;
            case '\\':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\\\");
              pos = i + 1;
              break;
            case '\r':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\r");
              pos = i + 1;
              break;
            case '\b':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\b");
              pos = i + 1;
              break;
            case '\f':
              this->Writer ::_do_write(s.range(pos, i));
              this->Writer ::_do_write("\\f");
              pos = i + 1;
              break;
            }
        }
        if(pos < s.len)
        {
            csubstr sub = s.sub(pos);
            this->Writer::_do_write(sub);
        }
        this->Writer::_do_write('"');
    }
}